

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void gen_gvec_op3_env(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int rm,undefined1 *fn)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined7 in_register_00000031;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_gvec_3_ptr_aarch64
            (tcg_ctx,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,rm * 0x100 + 0xc10,tcg_ctx->cpu_env,
             (int)CONCAT71(in_register_00000031,is_q) * 8 + 8,s->sve_len,0,fn);
  return;
}

Assistant:

static void gen_gvec_op3_env(DisasContext *s, bool is_q, int rd,
                             int rn, int rm, gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       vec_full_reg_offset(s, rm), tcg_ctx->cpu_env,
                       is_q ? 16 : 8, vec_full_reg_size(s), 0, fn);
}